

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O3

void scp_sink_coroutine(ScpSink *scp)

{
  fxp_attrs *pfVar1;
  SftpReplyBuilder *pSVar2;
  SftpServer *pSVar3;
  uchar *puVar4;
  ptrlen pVar5;
  ptrlen pVar6;
  ptrlen pVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  ScpSinkStackEntry *pSVar11;
  void *pvVar12;
  byte *pbVar13;
  ulonglong uVar14;
  char *pcVar15;
  size_t sVar16;
  size_t sVar17;
  SshChannelVtable *pSVar18;
  strbuf *psVar19;
  unsigned_long uVar20;
  char *fmt;
  SshChannel *pSVar21;
  byte *pbVar22;
  byte *pbVar23;
  ulong uVar24;
  ptrlen pVar25;
  unsigned_long dummy1;
  unsigned_long dummy2;
  void *local_78;
  uint64_t uStack_70;
  unsigned_long local_68;
  unsigned_long uStack_60;
  unsigned_long local_58;
  unsigned_long uStack_50;
  unsigned_long local_48;
  undefined1 local_38 [8];
  
  iVar9 = scp->crState;
  if (iVar9 < 0x4a3) {
    if (iVar9 == 0) goto LAB_00111410;
    if (iVar9 == 0x439) goto LAB_0011143c;
  }
  else {
    if (iVar9 == 0x4a3) goto LAB_0011184e;
    if (iVar9 == 0x4c0) {
LAB_001118f0:
      bVar8 = scp->input_eof;
      if ((_Bool)bVar8 == false) {
        sVar16 = bufchain_size(&scp->data);
        if (sVar16 == 0) {
          return;
        }
        bVar8 = scp->input_eof;
      }
      if ((bVar8 & 1) == 0) {
        bufchain_consume(&scp->data,1);
LAB_00111410:
        (*scp->sc->vt->write)(scp->sc,false,"",1);
        strbuf_shrink_to(scp->command,0);
        do {
          scp->crState = 0x439;
LAB_0011143c:
          bVar8 = scp->input_eof;
          if ((_Bool)bVar8 == false) {
            sVar16 = bufchain_size(&scp->data);
            if (sVar16 == 0) {
              return;
            }
            bVar8 = scp->input_eof;
          }
          if ((bVar8 & 1) != 0) goto LAB_00111941;
          pVar25 = bufchain_prefix(&scp->data);
          pvVar12 = memchr(pVar25.ptr,10,pVar25.len);
          sVar16 = (long)(((int)pvVar12 - (int)pVar25.ptr) + 1);
          if (pvVar12 == (void *)0x0) {
            sVar16 = pVar25.len;
          }
          BinarySink_put_data(scp->command->binarysink_,pVar25.ptr,sVar16);
          bufchain_consume(&scp->data,sVar16);
        } while (pvVar12 == (void *)0x0);
        strbuf_chomp(scp->command,'\n');
        psVar19 = scp->command;
        sVar16 = psVar19->len;
        if (sVar16 == 0) {
          scp->command_chr = '\0';
          sVar16 = 0;
        }
        else {
          pbVar13 = (byte *)psVar19->s;
          bVar8 = *pbVar13;
          scp->command_chr = bVar8;
          if (bVar8 - 0x43 < 2) {
            pfVar1 = &scp->attrs;
            (scp->attrs).flags = 4;
            (scp->attrs).permissions = 0;
            bVar8 = pbVar13[1];
            if ((bVar8 & 0xf8) == 0x30) {
              uVar20 = 0;
              do {
                uVar20 = (ulong)(byte)(bVar8 - 0x30) + uVar20 * 8;
                (scp->attrs).permissions = uVar20;
                bVar8 = pbVar13[2];
                pbVar13 = pbVar13 + 1;
              } while ((bVar8 & 0xf8) == 0x30);
            }
            if (bVar8 != 0x20) goto LAB_001117ce;
            pbVar13 = pbVar13 + 2;
            pbVar22 = pbVar13;
            pbVar23 = pbVar13;
            do {
              bVar8 = *pbVar23;
              pbVar23 = pbVar23 + 1;
              pbVar22 = pbVar22 + 1;
            } while ((byte)(bVar8 - 0x30) < 10);
            if (bVar8 != 0x20) goto LAB_001117ce;
            uVar14 = strtoull((char *)pbVar13,(char **)0x0,10);
            scp->file_size = uVar14;
            sVar16 = scp->command->len;
            pcVar15 = scp->command->s;
            strbuf_shrink_to(scp->filename_sb,0);
            BinarySink_put_datapl(scp->filename_sb->binarysink_,scp->head->destpath);
            if (scp->head->isdir == true) {
              psVar19 = scp->filename_sb;
              if ((psVar19->len != 0) && (psVar19->s[psVar19->len - 1] != '/')) {
                BinarySink_put_byte(psVar19->binarysink_,'/');
                psVar19 = scp->filename_sb;
              }
              pVar25.len = (size_t)(pcVar15 + (sVar16 - (long)pbVar22));
              pVar25.ptr = pbVar23;
              BinarySink_put_datapl(psVar19->binarysink_,pVar25);
            }
            psVar19 = scp->filename_sb;
            sVar16 = psVar19->len;
            pVar6.ptr = psVar19->u;
            pVar6.len = psVar19->len;
            pVar5.ptr = psVar19->u;
            pVar5.len = psVar19->len;
            (scp->filename).ptr = psVar19->u;
            (scp->filename).len = sVar16;
            if (scp->got_file_times == true) {
              uVar20 = scp->mtime;
              (scp->attrs).atime = scp->atime;
              (scp->attrs).mtime = uVar20;
              *(byte *)&(scp->attrs).flags = (byte)(scp->attrs).flags | 8;
            }
            scp->got_file_times = false;
            pSVar2 = &(scp->reply).srb;
            pSVar3 = scp->sf;
            if (scp->command_chr != 'D') goto LAB_0011173e;
            local_48 = (scp->attrs).mtime;
            local_78 = (void *)pfVar1->flags;
            uStack_70 = (scp->attrs).size;
            local_68 = (scp->attrs).uid;
            uStack_60 = (scp->attrs).gid;
            local_58 = (scp->attrs).permissions;
            uStack_50 = (scp->attrs).atime;
            (*pSVar3->vt->mkdir)(pSVar3,pSVar2,pVar5,*pfVar1);
            if ((scp->reply).err == true) {
              uVar10 = string_length_for_printf((scp->filename).len);
              pvVar12 = (scp->filename).ptr;
              pcVar15 = (scp->reply).errmsg;
              fmt = "\'%.*s\': unable to create directory: %s";
              goto LAB_00111825;
            }
            pvVar12 = (scp->filename).ptr;
            sVar16 = (scp->filename).len;
            pSVar11 = (ScpSinkStackEntry *)safemalloc(1,0x20,sVar16);
            (pSVar11->destpath).ptr = pSVar11 + 1;
            (pSVar11->destpath).len = sVar16;
            memcpy(pSVar11 + 1,pvVar12,sVar16);
            pSVar11->isdir = true;
            pSVar11->next = scp->head;
            scp->head = pSVar11;
            goto LAB_00111410;
          }
          if (bVar8 == 0x45) {
            pSVar11 = scp->head;
            if (pSVar11 == (ScpSinkStackEntry *)0x0) {
              pcVar15 = dupstr("received E command without matching D");
              goto LAB_0011182e;
            }
            scp->head = pSVar11->next;
            safefree(pSVar11);
            scp->got_file_times = false;
            goto LAB_00111410;
          }
          if (bVar8 == 0x54) {
            iVar9 = __isoc99_sscanf(pbVar13,"T%lu %lu %lu %lu",&scp->mtime,&local_78,&scp->atime,
                                    local_38);
            if (iVar9 != 4) {
              psVar19 = scp->command;
              sVar16 = psVar19->len;
              goto LAB_001117ce;
            }
            scp->got_file_times = true;
            goto LAB_00111410;
          }
        }
LAB_001117ce:
        puVar4 = psVar19->u;
        uVar10 = string_length_for_printf(sVar16);
        pcVar15 = dupprintf("unrecognised scp command \'%.*s\'",(ulong)uVar10,puVar4);
        goto LAB_0011182e;
      }
LAB_00111923:
      (*scp->sf->vt->close)(scp->sf,&(scp->reply).srb,(scp->reply).handle);
      goto LAB_00111941;
    }
    if (iVar9 == 0x4e8) goto LAB_001119c0;
  }
  iVar9 = 0;
  goto LAB_001119c0;
LAB_0011173e:
  local_48 = (scp->attrs).mtime;
  local_78 = (void *)pfVar1->flags;
  uStack_70 = (scp->attrs).size;
  local_68 = (scp->attrs).uid;
  uStack_60 = (scp->attrs).gid;
  local_58 = (scp->attrs).permissions;
  uStack_50 = (scp->attrs).atime;
  (*pSVar3->vt->open)(pSVar3,pSVar2,pVar6,0x1a,*pfVar1);
  if ((scp->reply).err == true) goto LAB_00111804;
  uVar24 = 0;
  (*scp->sc->vt->write)(scp->sc,false,"",1);
  scp->file_offset = 0;
  while (uVar24 < scp->file_size) {
    scp->crState = 0x4a3;
LAB_0011184e:
    bVar8 = scp->input_eof;
    if ((_Bool)bVar8 == false) {
      sVar16 = bufchain_size(&scp->data);
      if (sVar16 == 0) {
        return;
      }
      bVar8 = scp->input_eof;
    }
    if ((bVar8 & 1) != 0) goto LAB_00111923;
    pVar25 = bufchain_prefix(&scp->data);
    local_78 = pVar25.ptr;
    uVar24 = scp->file_size - scp->file_offset;
    if (pVar25.len < uVar24) {
      uVar24 = pVar25.len;
    }
    pVar7.len = uVar24;
    pVar7.ptr = local_78;
    uStack_70 = uVar24;
    (*scp->sf->vt->write)(scp->sf,&(scp->reply).srb,(scp->reply).handle,scp->file_offset,pVar7);
    if ((scp->reply).err == true) {
      uVar10 = string_length_for_printf((scp->filename).len);
      pvVar12 = (scp->filename).ptr;
      pcVar15 = (scp->reply).errmsg;
      fmt = "\'%.*s\': unable to write to file: %s";
      goto LAB_00111825;
    }
    bufchain_consume(&scp->data,uVar24);
    uVar24 = uVar24 + scp->file_offset;
    scp->file_offset = uVar24;
  }
  scp->crState = 0x4c0;
  goto LAB_001118f0;
LAB_00111804:
  uVar10 = string_length_for_printf((scp->filename).len);
  pvVar12 = (scp->filename).ptr;
  pcVar15 = (scp->reply).errmsg;
  fmt = "\'%.*s\': unable to open file: %s";
LAB_00111825:
  pcVar15 = dupprintf(fmt,(ulong)uVar10,pvVar12,pcVar15);
LAB_0011182e:
  scp->errmsg = pcVar15;
LAB_00111941:
  pSVar21 = scp->sc;
  pcVar15 = scp->errmsg;
  if (pcVar15 == (char *)0x0) {
    pSVar18 = pSVar21->vt;
  }
  else {
    sVar17 = strlen(pcVar15);
    (*pSVar21->vt->write)(pSVar21,true,pcVar15,sVar17);
    (*scp->sc->vt->write)(scp->sc,true,"\n",1);
    pSVar21 = scp->sc;
    pSVar18 = pSVar21->vt;
  }
  (*pSVar18->send_exit_status)(pSVar21,(uint)(pcVar15 != (char *)0x0));
  (*scp->sc->vt->write_eof)(scp->sc);
  (*scp->sc->vt->initiate_close)(scp->sc,scp->errmsg);
  iVar9 = 0x4e8;
LAB_001119c0:
  scp->crState = iVar9;
  return;
}

Assistant:

static void scp_sink_coroutine(ScpSink *scp)
{
    crBegin(scp->crState);

    while (1) {
        /*
         * Send an ack, and read a command.
         */
        sshfwd_write(scp->sc, "\0", 1);
        strbuf_clear(scp->command);
        while (1) {
            crMaybeWaitUntilV(scp->input_eof || bufchain_size(&scp->data) > 0);
            if (scp->input_eof)
                goto done;

            ptrlen data = bufchain_prefix(&scp->data);
            const char *cdata = data.ptr;
            const char *newline = memchr(cdata, '\012', data.len);
            if (newline)
                data.len = (int)(newline+1 - cdata);
            put_data(scp->command, cdata, data.len);
            bufchain_consume(&scp->data, data.len);

            if (newline)
                break;
        }

        /*
         * Parse the command.
         */
        strbuf_chomp(scp->command, '\n');
        scp->command_chr = scp->command->len > 0 ? scp->command->s[0] : '\0';
        if (scp->command_chr == 'T') {
            unsigned long dummy1, dummy2;
            if (sscanf(scp->command->s, "T%lu %lu %lu %lu",
                       &scp->mtime, &dummy1, &scp->atime, &dummy2) != 4)
                goto parse_error;
            scp->got_file_times = true;
        } else if (scp->command_chr == 'C' || scp->command_chr == 'D') {
            /*
             * Common handling of the start of this case, because the
             * messages are parsed similarly. We diverge later.
             */
            const char *q, *p = scp->command->s + 1; /* skip the 'C' */

            scp->attrs.flags = SSH_FILEXFER_ATTR_PERMISSIONS;
            scp->attrs.permissions = 0;
            while (*p >= '0' && *p <= '7') {
                scp->attrs.permissions =
                    scp->attrs.permissions * 8 + (*p - '0');
                p++;
            }
            if (*p != ' ')
                goto parse_error;
            p++;

            q = p;
            while (*p >= '0' && *p <= '9')
                p++;
            if (*p != ' ')
                goto parse_error;
            p++;
            scp->file_size = strtoull(q, NULL, 10);

            ptrlen leafname = make_ptrlen(
                p, scp->command->len - (p - scp->command->s));
            strbuf_clear(scp->filename_sb);
            put_datapl(scp->filename_sb, scp->head->destpath);
            if (scp->head->isdir) {
                if (scp->filename_sb->len > 0 &&
                    scp->filename_sb->s[scp->filename_sb->len-1]
                    != '/')
                    put_byte(scp->filename_sb, '/');
                put_datapl(scp->filename_sb, leafname);
            }
            scp->filename = ptrlen_from_strbuf(scp->filename_sb);

            if (scp->got_file_times) {
                scp->attrs.mtime = scp->mtime;
                scp->attrs.atime = scp->atime;
                scp->attrs.flags |= SSH_FILEXFER_ATTR_ACMODTIME;
            }
            scp->got_file_times = false;

            if (scp->command_chr == 'D') {
                sftpsrv_mkdir(scp->sf, &scp->reply.srb,
                              scp->filename, scp->attrs);

                if (scp->reply.err) {
                    scp->errmsg = dupprintf(
                        "'%.*s': unable to create directory: %s",
                        PTRLEN_PRINTF(scp->filename), scp->reply.errmsg);
                    goto done;
                }

                scp_sink_push(scp, scp->filename, true);
            } else {
                sftpsrv_open(scp->sf, &scp->reply.srb, scp->filename,
                             SSH_FXF_WRITE | SSH_FXF_CREAT | SSH_FXF_TRUNC,
                             scp->attrs);
                if (scp->reply.err) {
                    scp->errmsg = dupprintf(
                        "'%.*s': unable to open file: %s",
                        PTRLEN_PRINTF(scp->filename), scp->reply.errmsg);
                    goto done;
                }

                /*
                 * Now send an ack, and read the file data.
                 */
                sshfwd_write(scp->sc, "\0", 1);
                scp->file_offset = 0;
                while (scp->file_offset < scp->file_size) {
                    ptrlen data;
                    uint64_t this_len, remaining;

                    crMaybeWaitUntilV(
                        scp->input_eof || bufchain_size(&scp->data) > 0);
                    if (scp->input_eof) {
                        sftpsrv_close(scp->sf, &scp->reply.srb,
                                      scp->reply.handle);
                        goto done;
                    }

                    data = bufchain_prefix(&scp->data);
                    this_len = data.len;
                    remaining = scp->file_size - scp->file_offset;
                    if (this_len > remaining)
                        this_len = remaining;
                    sftpsrv_write(scp->sf, &scp->reply.srb,
                                  scp->reply.handle, scp->file_offset,
                                  make_ptrlen(data.ptr, this_len));
                    if (scp->reply.err) {
                        scp->errmsg = dupprintf(
                            "'%.*s': unable to write to file: %s",
                            PTRLEN_PRINTF(scp->filename), scp->reply.errmsg);
                        goto done;
                    }
                    bufchain_consume(&scp->data, this_len);
                    scp->file_offset += this_len;
                }

                /*
                 * Wait for the trailing NUL byte.
                 */
                crMaybeWaitUntilV(
                    scp->input_eof || bufchain_size(&scp->data) > 0);
                if (scp->input_eof) {
                    sftpsrv_close(scp->sf, &scp->reply.srb,
                                  scp->reply.handle);
                    goto done;
                }
                bufchain_consume(&scp->data, 1);
            }
        } else if (scp->command_chr == 'E') {
            if (!scp->head) {
                scp->errmsg = dupstr("received E command without matching D");
                goto done;
            }
            scp_sink_pop(scp);
            scp->got_file_times = false;
        } else {
            ptrlen cmd_pl;

            /*
             * Also come here if any of the above cases run into
             * parsing difficulties.
             */
          parse_error:
            cmd_pl = ptrlen_from_strbuf(scp->command);
            scp->errmsg = dupprintf("unrecognised scp command '%.*s'",
                                    PTRLEN_PRINTF(cmd_pl));
            goto done;
        }
    }

  done:
    if (scp->errmsg) {
        sshfwd_write_ext(scp->sc, true, scp->errmsg, strlen(scp->errmsg));
        sshfwd_write_ext(scp->sc, true, "\012", 1);
        sshfwd_send_exit_status(scp->sc, 1);
    } else {
        sshfwd_send_exit_status(scp->sc, 0);
    }
    sshfwd_write_eof(scp->sc);
    sshfwd_initiate_close(scp->sc, scp->errmsg);
    while (1) crReturnV;

    crFinishV;
}